

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge-coloring.cpp
# Opt level: O0

void __thiscall
msdfgen::edgeColoringSimple
          (msdfgen *this,Shape *shape,double angleThreshold,unsigned_long_long seed)

{
  int iVar1;
  EdgeColor EVar2;
  double crossThreshold_00;
  int iVar3;
  bool bVar4;
  pointer pCVar5;
  reference pEVar6;
  EdgeSegment *pEVar7;
  reference pEVar8;
  size_type sVar9;
  reference pvVar10;
  reference pvVar11;
  long lVar12;
  EdgeColor *pEVar13;
  int iVar14;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  double in_XMM1_Qa;
  double dVar15;
  double dVar16;
  Vector2 VVar17;
  int local_174;
  int index_1;
  int i_2;
  EdgeColor initialColor;
  EdgeColor color;
  int m_1;
  int start;
  int spline;
  int cornerCount;
  int local_14c;
  long lStack_148;
  int i_1;
  EdgeSegment *parts [7];
  int local_104;
  int i;
  int m;
  int corner;
  EdgeColor colors [3];
  __normal_iterator<msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
  local_e0;
  iterator edge_1;
  Vector2 local_c8;
  Vector2 local_b8;
  Vector2 local_a8;
  __normal_iterator<msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
  local_98;
  __normal_iterator<msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
  local_90;
  __normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
  local_88;
  const_iterator edge;
  int index;
  __normal_iterator<msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
  local_70;
  __normal_iterator<msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
  local_68;
  undefined1 local_60 [8];
  Vector2 prevDirection;
  __normal_iterator<msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
  local_48;
  iterator contour;
  vector<int,_std::allocator<int>_> corners;
  double crossThreshold;
  unsigned_long_long seed_local;
  double angleThreshold_local;
  Shape *shape_local;
  
  crossThreshold = (double)shape;
  seed_local = (unsigned_long_long)angleThreshold;
  angleThreshold_local = (double)this;
  crossThreshold_00 = sin(angleThreshold);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&contour);
  local_48._M_current =
       (Contour *)
       std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>::begin
                 ((vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_> *)
                  angleThreshold_local);
  while( true ) {
    prevDirection.y =
         (double)std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>::end
                           ((vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_> *)
                            angleThreshold_local);
    bVar4 = __gnu_cxx::operator!=
                      (&local_48,
                       (__normal_iterator<msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
                        *)&prevDirection.y);
    if (!bVar4) break;
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)&contour);
    pCVar5 = __gnu_cxx::
             __normal_iterator<msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
             ::operator->(&local_48);
    bVar4 = std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::empty
                      (&pCVar5->edges);
    dVar16 = in_XMM1_Qa;
    if (!bVar4) {
      pCVar5 = __gnu_cxx::
               __normal_iterator<msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
               ::operator->(&local_48);
      local_70._M_current =
           (EdgeHolder *)
           std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::end
                     (&pCVar5->edges);
      local_68 = __gnu_cxx::
                 __normal_iterator<msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
                 ::operator-(&local_70,1);
      pEVar6 = __gnu_cxx::
               __normal_iterator<msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
               ::operator*(&local_68);
      pEVar7 = EdgeHolder::operator->(pEVar6);
      (*pEVar7->_vptr_EdgeSegment[4])(0);
      dVar16 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      edge._M_current._0_4_ = 0;
      prevDirection.x = in_XMM1_Qa;
      pCVar5 = __gnu_cxx::
               __normal_iterator<msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
               ::operator->(&local_48);
      local_90._M_current =
           (EdgeHolder *)
           std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::begin
                     (&pCVar5->edges);
      __gnu_cxx::
      __normal_iterator<msdfgen::EdgeHolder_const*,std::vector<msdfgen::EdgeHolder,std::allocator<msdfgen::EdgeHolder>>>
      ::__normal_iterator<msdfgen::EdgeHolder*>
                ((__normal_iterator<msdfgen::EdgeHolder_const*,std::vector<msdfgen::EdgeHolder,std::allocator<msdfgen::EdgeHolder>>>
                  *)&local_88,&local_90);
      while( true ) {
        pCVar5 = __gnu_cxx::
                 __normal_iterator<msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
                 ::operator->(&local_48);
        local_98._M_current =
             (EdgeHolder *)
             std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::end
                       (&pCVar5->edges);
        bVar4 = __gnu_cxx::operator!=(&local_88,&local_98);
        if (!bVar4) break;
        VVar17 = Vector2::normalize((Vector2 *)local_60,false);
        local_a8.y = VVar17.y;
        dVar16 = VVar17.x;
        local_a8.x = dVar16;
        pEVar8 = __gnu_cxx::
                 __normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
                 ::operator*(&local_88);
        pEVar7 = EdgeHolder::operator->(pEVar8);
        (*pEVar7->_vptr_EdgeSegment[4])(0);
        local_c8.y = dVar16;
        VVar17 = Vector2::normalize(&local_c8,false);
        local_b8.y = VVar17.y;
        dVar15 = VVar17.x;
        local_b8.x = dVar15;
        bVar4 = isCorner(&local_a8,&local_b8,crossThreshold_00);
        if (bVar4) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)&contour,(value_type_conflict *)&edge);
        }
        pEVar8 = __gnu_cxx::
                 __normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
                 ::operator*(&local_88);
        pEVar7 = EdgeHolder::operator->(pEVar8);
        (*pEVar7->_vptr_EdgeSegment[4])(0);
        dVar16 = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
        prevDirection.x = dVar15;
        __gnu_cxx::
        __normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
        ::operator++(&local_88);
        edge._M_current._0_4_ = (int)edge._M_current + 1;
      }
    }
    bVar4 = std::vector<int,_std::allocator<int>_>::empty
                      ((vector<int,_std::allocator<int>_> *)&contour);
    if (bVar4) {
      pCVar5 = __gnu_cxx::
               __normal_iterator<msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
               ::operator->(&local_48);
      local_e0._M_current =
           (EdgeHolder *)
           std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::begin
                     (&pCVar5->edges);
      while( true ) {
        pCVar5 = __gnu_cxx::
                 __normal_iterator<msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
                 ::operator->(&local_48);
        register0x00000000 =
             std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::end
                       (&pCVar5->edges);
        bVar4 = __gnu_cxx::operator!=
                          (&local_e0,
                           (__normal_iterator<msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
                            *)(colors + 2));
        if (!bVar4) break;
        pEVar6 = __gnu_cxx::
                 __normal_iterator<msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
                 ::operator*(&local_e0);
        pEVar7 = EdgeHolder::operator->(pEVar6);
        pEVar7->color = WHITE;
        __gnu_cxx::
        __normal_iterator<msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
        ::operator++(&local_e0);
      }
    }
    else {
      sVar9 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)&contour);
      if (sVar9 == 1) {
        _m = 0x700000007;
        colors[0] = BLACK;
        switchColor((EdgeColor *)&m,(unsigned_long_long *)&crossThreshold,BLACK);
        colors[0] = m;
        switchColor(colors,(unsigned_long_long *)&crossThreshold,BLACK);
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)&contour,0);
        iVar1 = *pvVar10;
        pCVar5 = __gnu_cxx::
                 __normal_iterator<msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
                 ::operator->(&local_48);
        sVar9 = std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::size
                          (&pCVar5->edges);
        if (sVar9 < 3) {
          pCVar5 = __gnu_cxx::
                   __normal_iterator<msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
                   ::operator->(&local_48);
          sVar9 = std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::size
                            (&pCVar5->edges);
          if (sVar9 != 0) {
            parts[3] = (EdgeSegment *)0x0;
            parts[4] = (EdgeSegment *)0x0;
            parts[1] = (EdgeSegment *)0x0;
            parts[2] = (EdgeSegment *)0x0;
            lStack_148 = 0;
            parts[0] = (EdgeSegment *)0x0;
            parts[5] = (EdgeSegment *)0x0;
            pCVar5 = __gnu_cxx::
                     __normal_iterator<msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
                     ::operator->(&local_48);
            pvVar11 = std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::
                      operator[](&pCVar5->edges,0);
            pEVar7 = EdgeHolder::operator->(pvVar11);
            lVar12 = (long)(iVar1 * 3);
            (*pEVar7->_vptr_EdgeSegment[10])
                      (pEVar7,parts + lVar12 + -1,parts + lVar12,parts + lVar12 + 1);
            pCVar5 = __gnu_cxx::
                     __normal_iterator<msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
                     ::operator->(&local_48);
            sVar9 = std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::size
                              (&pCVar5->edges);
            if (sVar9 < 2) {
              *(int *)(lStack_148 + 8) = m;
              parts[0]->color = corner;
              parts[1]->color = colors[0];
            }
            else {
              pCVar5 = __gnu_cxx::
                       __normal_iterator<msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
                       ::operator->(&local_48);
              pvVar11 = std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::
                        operator[](&pCVar5->edges,1);
              pEVar7 = EdgeHolder::operator->(pvVar11);
              (*pEVar7->_vptr_EdgeSegment[10])
                        (pEVar7,parts + (long)(iVar1 * -3 + 3) + -1,
                         parts + (long)(iVar1 * -3 + 4) + -1,parts + (long)(iVar1 * -3 + 5) + -1);
              parts[0]->color = m;
              *(int *)(lStack_148 + 8) = m;
              parts[2]->color = corner;
              parts[1]->color = corner;
              parts[4]->color = colors[0];
              parts[3]->color = colors[0];
            }
            pCVar5 = __gnu_cxx::
                     __normal_iterator<msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
                     ::operator->(&local_48);
            std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::clear
                      (&pCVar5->edges);
            local_14c = 0;
            while (parts[(long)local_14c + -1] != (EdgeSegment *)0x0) {
              pCVar5 = __gnu_cxx::
                       __normal_iterator<msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
                       ::operator->(&local_48);
              EdgeHolder::EdgeHolder((EdgeHolder *)&spline,parts[(long)local_14c + -1]);
              std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::push_back
                        (&pCVar5->edges,(value_type *)&spline);
              EdgeHolder::~EdgeHolder((EdgeHolder *)&spline);
              local_14c = local_14c + 1;
            }
          }
        }
        else {
          pCVar5 = __gnu_cxx::
                   __normal_iterator<msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
                   ::operator->(&local_48);
          sVar9 = std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::size
                            (&pCVar5->edges);
          iVar14 = (int)sVar9;
          for (local_104 = 0; local_104 < iVar14; local_104 = local_104 + 1) {
            dVar16 = 0.5;
            EVar2 = colors[(long)((int)(((double)local_104 * 2.875) / (double)(iVar14 + -1) + 3.0 +
                                        -1.4375 + 0.5) + -3) + -1];
            pCVar5 = __gnu_cxx::
                     __normal_iterator<msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
                     ::operator->(&local_48);
            pvVar11 = std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::
                      operator[](&pCVar5->edges,(long)((iVar1 + local_104) % iVar14));
            pEVar7 = EdgeHolder::operator->(pvVar11);
            pEVar7->color = EVar2;
          }
        }
      }
      else {
        sVar9 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)&contour);
        start = (int)sVar9;
        m_1 = 0;
        pEVar13 = (EdgeColor *)
                  std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)&contour,0);
        color = *pEVar13;
        pCVar5 = __gnu_cxx::
                 __normal_iterator<msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
                 ::operator->(&local_48);
        sVar9 = std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::size
                          (&pCVar5->edges);
        initialColor = (EdgeColor)sVar9;
        i_2 = 7;
        switchColor((EdgeColor *)&i_2,(unsigned_long_long *)&crossThreshold,BLACK);
        iVar1 = i_2;
        for (local_174 = 0; local_174 < (int)initialColor; local_174 = local_174 + 1) {
          iVar14 = (int)(color + local_174) % (int)initialColor;
          if ((m_1 + 1 < start) &&
             (pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)&contour,(long)(m_1 + 1)),
             *pvVar10 == iVar14)) {
            m_1 = m_1 + 1;
            switchColor((EdgeColor *)&i_2,(unsigned_long_long *)&crossThreshold,
                        (uint)(m_1 == start + -1) * iVar1);
          }
          iVar3 = i_2;
          pCVar5 = __gnu_cxx::
                   __normal_iterator<msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
                   ::operator->(&local_48);
          pvVar11 = std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::
                    operator[](&pCVar5->edges,(long)iVar14);
          pEVar7 = EdgeHolder::operator->(pvVar11);
          pEVar7->color = iVar3;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
    ::operator++(&local_48);
    in_XMM1_Qa = dVar16;
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&contour);
  return;
}

Assistant:

void edgeColoringSimple(Shape &shape, double angleThreshold, unsigned long long seed) {
    double crossThreshold = sin(angleThreshold);
    std::vector<int> corners;
    for (std::vector<Contour>::iterator contour = shape.contours.begin(); contour != shape.contours.end(); ++contour) {
        // Identify corners
        corners.clear();
        if (!contour->edges.empty()) {
            Vector2 prevDirection = (*(contour->edges.end()-1))->direction(1);
            int index = 0;
            for (std::vector<EdgeHolder>::const_iterator edge = contour->edges.begin(); edge != contour->edges.end(); ++edge, ++index) {
                if (isCorner(prevDirection.normalize(), (*edge)->direction(0).normalize(), crossThreshold))
                    corners.push_back(index);
                prevDirection = (*edge)->direction(1);
            }
        }

        // Smooth contour
        if (corners.empty())
            for (std::vector<EdgeHolder>::iterator edge = contour->edges.begin(); edge != contour->edges.end(); ++edge)
                (*edge)->color = WHITE;
        // "Teardrop" case
        else if (corners.size() == 1) {
            EdgeColor colors[3] = { WHITE, WHITE };
            switchColor(colors[0], seed);
            switchColor(colors[2] = colors[0], seed);
            int corner = corners[0];
            if (contour->edges.size() >= 3) {
                int m = contour->edges.size();
                for (int i = 0; i < m; ++i)
                    contour->edges[(corner+i)%m]->color = (colors+1)[int(3+2.875*i/(m-1)-1.4375+.5)-3];
            } else if (contour->edges.size() >= 1) {
                // Less than three edge segments for three colors => edges must be split
                EdgeSegment *parts[7] = { };
                contour->edges[0]->splitInThirds(parts[0+3*corner], parts[1+3*corner], parts[2+3*corner]);
                if (contour->edges.size() >= 2) {
                    contour->edges[1]->splitInThirds(parts[3-3*corner], parts[4-3*corner], parts[5-3*corner]);
                    parts[0]->color = parts[1]->color = colors[0];
                    parts[2]->color = parts[3]->color = colors[1];
                    parts[4]->color = parts[5]->color = colors[2];
                } else {
                    parts[0]->color = colors[0];
                    parts[1]->color = colors[1];
                    parts[2]->color = colors[2];
                }
                contour->edges.clear();
                for (int i = 0; parts[i]; ++i)
                    contour->edges.push_back(EdgeHolder(parts[i]));
            }
        }
        // Multiple corners
        else {
            int cornerCount = corners.size();
            int spline = 0;
            int start = corners[0];
            int m = contour->edges.size();
            EdgeColor color = WHITE;
            switchColor(color, seed);
            EdgeColor initialColor = color;
            for (int i = 0; i < m; ++i) {
                int index = (start+i)%m;
                if (spline+1 < cornerCount && corners[spline+1] == index) {
                    ++spline;
                    switchColor(color, seed, EdgeColor((spline == cornerCount-1)*initialColor));
                }
                contour->edges[index]->color = color;
            }
        }
    }
}